

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

int Q_filelength(FILE *f)

{
  long lVar1;
  long lVar2;
  int end;
  int pos;
  FILE *f_local;
  
  lVar1 = ftell((FILE *)f);
  fseek((FILE *)f,0,2);
  lVar2 = ftell((FILE *)f);
  fseek((FILE *)f,(long)(int)lVar1,0);
  return (int)lVar2;
}

Assistant:

int Q_filelength (FILE *f)
{
	int		pos;
	int		end;

	pos = ftell (f);
	fseek (f, 0, SEEK_END);
	end = ftell (f);
	fseek (f, pos, SEEK_SET);

	return end;
}